

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<int,unsigned_long>(void)

{
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  uint uVar2;
  unsigned_long in_stack_ffffffffffffffa8;
  unsigned_long u;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  unsigned_long local_40;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_34;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  
  u = 0;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_long>(&local_34,&u);
  su.m_int = u;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_long>(&st2,&su);
  local_34.m_int = 0;
  SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_34,&u);
  if (su.m_int >> 0x1f == 0) {
    local_34.m_int = st2.m_int;
    SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_34);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
              (&local_34,st2);
    operator*(u,local_34);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,su);
    u = 1;
    uVar2 = 1;
    local_40._0_4_ = 1;
    local_34.m_int = uVar2;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_40);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    st2.m_int = uVar2;
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
              (&local_34,
               (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
               )0x1);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,su);
    u = 1;
    st2.m_int = uVar2;
    local_34.m_int = uVar2;
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,1);
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
              (&local_34,st2);
    operator/(u,local_34);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,su);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
              (&local_34,st2);
    operator+(u,local_34);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,su);
    local_34.m_int = 0;
    u = 0;
    st2.m_int = 0;
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,0);
    SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
              (&local_34,st2);
    operator-(in_stack_ffffffffffffffa8,
              (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
              0x0);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    local_40._0_4_ = 1;
    local_34.m_int = uVar2;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_40);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,su);
    u = 1;
    local_40 = CONCAT44(local_40._4_4_,1);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_40);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    SVar1 = SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
            operator<<((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                        *)&local_34,su);
    operator<<(SVar1.m_int,su);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,su);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    SVar1 = SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
            operator>>((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                        *)&local_34,su);
    operator>>(SVar1.m_int,su);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,u);
    SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
              ((SafeInt<int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
               )&local_34,su);
    local_40 = BinaryAndHelper<unsigned_long,_int,_3>::And(su.m_int,local_34.m_int & (uint)u);
    SafeInt::operator_cast_to_int((SafeInt *)&local_40);
    local_34.m_int = (uint)su.m_int & (uint)u & local_34.m_int & st2.m_int;
    local_40 = BinaryOrHelper<unsigned_long,_int,_3>::Or(su.m_int,(uint)u);
    SafeInt::operator_cast_to_int((SafeInt *)&local_40);
    local_34.m_int = (uint)su.m_int | (uint)u | local_34.m_int | st2.m_int;
    local_40 = BinaryXorHelper<unsigned_long,_int,_3>::Xor(su.m_int,local_34.m_int ^ (uint)u);
    SafeInt::operator_cast_to_int((SafeInt *)&local_40);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}